

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blocksort.c
# Opt level: O0

UChar mmed3(UChar a,UChar b,UChar c)

{
  byte local_a;
  byte local_9;
  UChar t;
  UChar c_local;
  UChar b_local;
  UChar a_local;
  
  local_a = b;
  local_9 = a;
  if (b < a) {
    local_a = a;
    local_9 = b;
  }
  if ((c < local_a) && (local_a = c, c < local_9)) {
    local_a = local_9;
  }
  return local_a;
}

Assistant:

static 
__inline__
UChar mmed3 ( UChar a, UChar b, UChar c )
{
   UChar t;
   if (a > b) { t = a; a = b; b = t; };
   if (b > c) { 
      b = c;
      if (a > b) b = a;
   }
   return b;
}